

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareSimulateSetElem(Odc_Man_t *p)

{
  Odc_Lit_t Lit;
  uint *p_00;
  uint *q;
  int local_24;
  int k;
  uint *pData2;
  uint *pData;
  Odc_Man_t *p_local;
  
  for (local_24 = 0; local_24 < p->nVarsMax; local_24 = local_24 + 1) {
    Lit = Odc_Var(p,local_24);
    p_00 = Odc_ObjTruth(p,Lit);
    q = (uint *)Vec_PtrEntry(p->vTruthsElem,local_24);
    Abc_InfoCopy(p_00,q,p->nWords);
  }
  return;
}

Assistant:

void Abc_NtkDontCareSimulateSetElem( Odc_Man_t * p )
{
    unsigned * pData, * pData2;
    int k;
    for ( k = 0; k < p->nVarsMax; k++ )
    {
        pData = Odc_ObjTruth( p, Odc_Var(p, k) );
        pData2 = (unsigned *)Vec_PtrEntry( p->vTruthsElem, k );
        Abc_InfoCopy( pData, pData2, p->nWords );
    }
}